

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.cpp
# Opt level: O0

void __thiscall GetOpt::GetOpt_pp::TokensDeleter::~TokensDeleter(TokensDeleter *this)

{
  Token *pTVar1;
  Token *local_20;
  Token *current;
  Token *next;
  TokensDeleter *this_local;
  
  pTVar1 = *this->_first;
  while (local_20 = pTVar1, local_20 != (Token *)0x0) {
    pTVar1 = local_20->next;
    if (local_20 != (Token *)0x0) {
      Token::~Token(local_20);
      operator_delete(local_20);
    }
  }
  return;
}

Assistant:

GETOPT_INLINE GetOpt_pp::TokensDeleter::~TokensDeleter()
{
    Token* next;
    Token* current(_first);
    while (current != NULL)
    {
        next = current->next;
        delete current;
        current = next;
    }
}